

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SetColor(FParser *this)

{
  bool bVar1;
  int tagnum_00;
  int iVar2;
  uint32 other;
  FDynamicColormap *pFVar3;
  FSectorTagIterator local_2c;
  FSSectorTagIterator itr;
  PalEntry color;
  int i;
  int c;
  int secnum;
  int tagnum;
  FParser *this_local;
  
  itr.super_FSectorTagIterator.start = -1;
  PalEntry::PalEntry((PalEntry *)&itr,0);
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    tagnum_00 = intvalue(this->t_argv);
    iVar2 = T_FindFirstSectorFromTag(tagnum_00);
    if (-1 < iVar2) {
      if ((this->t_argc < 2) || (3 < this->t_argc)) {
        if (this->t_argc < 4) {
          return;
        }
        iVar2 = intvalue(this->t_argv + 1);
        itr.super_FSectorTagIterator.searchtag._0_3_ =
             CONCAT12((char)iVar2,(undefined2)itr.super_FSectorTagIterator.searchtag);
        iVar2 = intvalue(this->t_argv + 2);
        itr.super_FSectorTagIterator.searchtag._0_2_ =
             CONCAT11((char)iVar2,(undefined1)itr.super_FSectorTagIterator.searchtag);
        iVar2 = intvalue(this->t_argv + 3);
        itr.super_FSectorTagIterator.searchtag =
             CONCAT31(itr.super_FSectorTagIterator.searchtag._1_3_,(char)iVar2);
        itr.super_FSectorTagIterator.searchtag = itr.super_FSectorTagIterator.searchtag & 0xffffff;
      }
      else {
        other = intvalue(this->t_argv + 1);
        PalEntry::operator=((PalEntry *)&itr,other);
      }
      FSSectorTagIterator::FSSectorTagIterator((FSSectorTagIterator *)&local_2c,tagnum_00);
      while (itr.super_FSectorTagIterator.start = FSectorTagIterator::Next(&local_2c),
            -1 < itr.super_FSectorTagIterator.start) {
        pFVar3 = GetSpecialLights((PalEntry)itr.super_FSectorTagIterator.searchtag,
                                  (PalEntry)
                                  ((sectors[itr.super_FSectorTagIterator.start].ColorMap)->Fade).
                                  field_0.field_0,0);
        sectors[itr.super_FSectorTagIterator.start].ColorMap = pFVar3;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SetColor(void)
{
	int tagnum, secnum;
	int c=2;
	int i = -1;
	PalEntry color=0;
	
	if (CheckArgs(2))
	{
		tagnum = intvalue(t_argv[0]);
		
		secnum = T_FindFirstSectorFromTag(tagnum);
		
		if(secnum < 0)
		{ 
			return;
		}
		
		if(t_argc >1 && t_argc<4)
		{
			color=intvalue(t_argv[1]);
		}
		else if (t_argc>=4)
		{
			color.r=intvalue(t_argv[1]);
			color.g=intvalue(t_argv[2]);
			color.b=intvalue(t_argv[3]);
			color.a=0;
		}
		else return;

		// set all sectors with tag
		FSSectorTagIterator itr(tagnum);
		while ((i = itr.Next()) >= 0)
		{
			sectors[i].ColorMap = GetSpecialLights (color, sectors[i].ColorMap->Fade, 0);
		}
	}
}